

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparamsbase.cpp
# Opt level: O0

unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>
CreateBaseChainParams(ChainType chain)

{
  undefined4 in_ESI;
  __uniq_ptr_data<CBaseChainParams,_std::default_delete<CBaseChainParams>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  char (*__args) [9];
  
  __args = *(char (**) [9])(in_FS_OFFSET + 0x28);
  switch(in_ESI) {
  case 0:
    std::make_unique<CBaseChainParams,char_const(&)[1],int,int>
              ((char (*) [1])__args,(int *)0x208c0000208e,
               (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    break;
  case 1:
    std::make_unique<CBaseChainParams,char_const(&)[9],int,int>
              (__args,(int *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               (int *)0x479c0000479e);
    break;
  case 2:
    std::make_unique<CBaseChainParams,char_const(&)[7],int,int>
              ((char (*) [7])__args,
               (int *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    break;
  case 3:
    std::make_unique<CBaseChainParams,char_const(&)[8],int,int>
              ((char (*) [8])__args,
               (int *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    break;
  case 4:
    std::make_unique<CBaseChainParams,char_const(&)[9],int,int>
              (__args,(int *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chainparamsbase.cpp"
                  ,0x36,"std::unique_ptr<CBaseChainParams> CreateBaseChainParams(const ChainType)");
  }
  if (*(char (**) [9])(in_FS_OFFSET + 0x28) != __args) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<CBaseChainParams,_std::default_delete<CBaseChainParams>,_true,_true>)
         (tuple<CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>)
         in_RDI.super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t
         .super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
         super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CBaseChainParams> CreateBaseChainParams(const ChainType chain)
{
    switch (chain) {
    case ChainType::MAIN:
        return std::make_unique<CBaseChainParams>("", 8332, 8334);
    case ChainType::TESTNET:
        return std::make_unique<CBaseChainParams>("testnet3", 18332, 18334);
    case ChainType::TESTNET4:
        return std::make_unique<CBaseChainParams>("testnet4", 48332, 48334);
    case ChainType::SIGNET:
        return std::make_unique<CBaseChainParams>("signet", 38332, 38334);
    case ChainType::REGTEST:
        return std::make_unique<CBaseChainParams>("regtest", 18443, 18445);
    }
    assert(false);
}